

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rotating_log.cpp
# Opt level: O0

void __thiscall
RotatingLog_TwoRotations_Test::~RotatingLog_TwoRotations_Test(RotatingLog_TwoRotations_Test *this)

{
  RotatingLog_TwoRotations_Test *this_local;
  
  ~RotatingLog_TwoRotations_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (RotatingLog, TwoRotations) {
    using ::testing::_;
    using ::testing::AnyNumber;
    using ::testing::Invoke;
    using ::testing::Return;
    using ::testing::StrEq;

    using log_type = pstore::basic_rotating_log<mock_string_stream_traits, mock_file_system_traits>;

    // We'll contrive two rollovers by generating at least max_size * num_backups
    // worth of output.
    constexpr auto max_size = std::streamoff{100};
    constexpr auto num_backups = 2U;
    log_type log ("base_name", max_size, num_backups);

    // Check that the rollover process renames bn1->bn2 and bn->bn1 twice each (once
    // for each rollover. I also check that we open the real output file three times;
    // that is, two rollovers and a partially filled third file.
    {
        auto & string_stream = log.stream_traits ();
        auto & file_system = log.file_system_traits ();

        // I need the clear() method to really clear the stream contents.
        EXPECT_CALL (string_stream, clear (_))
            .Times (AnyNumber ())
            .WillRepeatedly (Invoke ([] (std::ostringstream & os) { os.str (""); }));

        EXPECT_CALL (string_stream, open (_, StrEq ("base_name"), _)).Times (3);
        EXPECT_CALL (string_stream, close (_)).Times (3);

        EXPECT_CALL (file_system, exists (_)).WillRepeatedly (Return (true));
        EXPECT_CALL (file_system, unlink (_)).Times (AnyNumber ());
        EXPECT_CALL (file_system, rename (StrEq ("base_name.1"), StrEq ("base_name.2"))).Times (2);
        EXPECT_CALL (file_system, rename (StrEq ("base_name"), StrEq ("base_name.1"))).Times (2);
    }

    // Put together an array of strings which contain "message" followed by the decimal offset
    // of the string. We want one more than will fit in "max_size" bytes (not including line
    // feeds).
    std::vector<std::string> messages;
    {
        auto size = std::streamoff{0};
        auto index = 1U;
        while (size < max_size * num_backups) {
            std::ostringstream str;
            str << "message " << index;
            std::string const & message = str.str ();
            messages.push_back (message);

            size += message.size ();
            ++index;
        }
    }
    // Now log each of the strings.
    for (auto const & m : messages) {
        log.log_impl (m);
    }

    // A single copy of the string is left in the active "file".
    EXPECT_EQ ("message 21", log.stream ().str ());
}